

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O1

void __thiscall YAJLTables::fetch_etable(YAJLTables *this,u16 marker,bitio_stream *bstream)

{
  undefined8 *puVar1;
  int i;
  ssize_t sVar2;
  YAJLArithmeticTable *this_00;
  ulong uVar3;
  YAJLHuffmanTable *this_01;
  long lVar4;
  undefined8 extraout_RAX;
  size_t in_RCX;
  ulong uVar5;
  int iVar6;
  undefined6 in_register_00000032;
  void *unaff_R13;
  ushort uVar7;
  uint uVar8;
  YAJLEntropyTable local_48;
  
  sVar2 = bitio::bitio_stream::read(bstream,0x10,bstream,in_RCX);
  uVar8 = (int)sVar2 - 2;
  iVar6 = (int)CONCAT62(in_register_00000032,marker);
  uVar7 = (ushort)uVar8;
  if (iVar6 == 0xffc4) {
    while (uVar7 != 0) {
      local_48.marker = 0;
      local_48.huffman_table = (YAJLHuffmanTable *)0x0;
      local_48.arithmetic_table = (YAJLArithmeticTable *)0x0;
      YAJLEntropyTable::set_marker(&local_48,marker);
      this_01 = (YAJLHuffmanTable *)operator_new(0x28);
      YAJLHuffmanTable::YAJLHuffmanTable(this_01,bstream);
      uVar8 = uVar8 - 0x11;
      lVar4 = 0;
      do {
        uVar8 = uVar8 - this_01->ncodes[lVar4];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x10);
      local_48.huffman_table = this_01;
      if (3 < this_01->table_dest) {
        __assert_fail("etable.huffman_table->table_dest < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x5e,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      uVar3 = (ulong)this_01->table_class;
      if (1 < uVar3) {
        __assert_fail("etable.huffman_table->table_class < 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x5f,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      uVar5 = (ulong)((uint)this_01->table_dest * 0x30);
      *(YAJLArithmeticTable **)((long)&this->etables[0][uVar3].arithmetic_table + uVar5) =
           local_48.arithmetic_table;
      puVar1 = (undefined8 *)((long)&this->etables[0][uVar3].marker + uVar5);
      *puVar1 = CONCAT62(local_48._2_6_,local_48.marker);
      puVar1[1] = this_01;
      uVar7 = (ushort)uVar8;
    }
  }
  else {
    if (iVar6 != 0xffcc) {
      fetch_etable();
      operator_delete(unaff_R13,0x28);
      _Unwind_Resume(extraout_RAX);
    }
    while (uVar7 != 0) {
      local_48.marker = 0;
      local_48.huffman_table = (YAJLHuffmanTable *)0x0;
      local_48.arithmetic_table = (YAJLArithmeticTable *)0x0;
      YAJLEntropyTable::set_marker(&local_48,marker);
      this_00 = (YAJLArithmeticTable *)operator_new(3);
      YAJLArithmeticTable::YAJLArithmeticTable(this_00,bstream);
      local_48.arithmetic_table = this_00;
      if (3 < this_00->table_dest) {
        __assert_fail("etable.arithmetic_table->table_dest < 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x69,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      uVar3 = (ulong)this_00->table_class;
      if (1 < uVar3) {
        __assert_fail("etable.arithmetic_table->table_class < 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/supercmmetry[P]yajl/src/misc.cpp"
                      ,0x6a,"void YAJLTables::fetch_etable(u16, bitio::bitio_stream *)");
      }
      uVar5 = (ulong)((uint)this_00->table_dest * 0x30);
      *(YAJLArithmeticTable **)((long)&this->etables[0][uVar3].arithmetic_table + uVar5) = this_00;
      puVar1 = (undefined8 *)((long)&this->etables[0][uVar3].marker + uVar5);
      *puVar1 = CONCAT62(local_48._2_6_,local_48.marker);
      puVar1[1] = local_48.huffman_table;
      uVar7 = (short)uVar8 - 2;
      uVar8 = (uint)uVar7;
    }
  }
  return;
}

Assistant:

void YAJLTables::fetch_etable(u16 marker, bitio::bitio_stream *bstream) {
    u16 length = bstream->read(0x10);
    length -= 2;
    if (marker == markers::DHT) {
        while (length > 0) {
            YAJLEntropyTable etable{};
            etable.set_marker(marker);
            etable.huffman_table = new YAJLHuffmanTable(bstream);

            length -= 17;
            for (int i = 0; i < 16; i++) {
                length -= etable.huffman_table->ncodes[i];
            }

            assert(etable.huffman_table->table_dest < 4);
            assert(etable.huffman_table->table_class < 2);

            etables[etable.huffman_table->table_dest][etable.huffman_table->table_class] = etable;
        }
    } else if (marker == markers::DAC) {
        while (length > 0) {
            YAJLEntropyTable etable{};
            etable.set_marker(marker);
            etable.arithmetic_table = new YAJLArithmeticTable(bstream);

            assert(etable.arithmetic_table->table_dest < 4);
            assert(etable.arithmetic_table->table_class < 2);
            etables[etable.arithmetic_table->table_dest][etable.arithmetic_table->table_class] = etable;
            length -= 2;
        }
    } else {
        fprintf(stderr, "Unhandled marker at: %s\n", __FILE__);
        exit(1);
    }
}